

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::format_float_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,float value)

{
  char in_DL;
  
  if (this->float_formatter == (FloatFormatter *)0x0) {
    convert_to_string_abi_cxx11_
              (__return_storage_ptr__,
               (spirv_cross *)(ulong)(uint)(int)this->current_locale_radix_character,value,in_DL);
  }
  else {
    (**(code **)(*(long *)this->float_formatter + 0x10))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::format_float(float value) const
{
	if (float_formatter)
		return float_formatter->format_float(value);

	// default behavior
	return convert_to_string(value, current_locale_radix_character);
}